

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O3

int SMPI_Allreduce(void *sendbuf,void *recvbuf,int count,SMPI_Datatype datatype,SMPI_Op op,
                  SMPI_Comm comm)

{
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> _Var1;
  Datatype DVar2;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  switch(datatype) {
  case SMPI_INT:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,1,&local_48);
    }
    break;
  case SMPI_LONG:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,1,&local_48);
    }
    break;
  case SMPI_SIZE_T:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,1,&local_48);
    }
    break;
  case SMPI_CHAR:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,1,&local_48);
    }
    break;
  case SMPI_BYTE:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      _Var1._M_head_impl =
           (comm->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
           .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (*(_Var1._M_head_impl)->_vptr_CommImpl[0xd])
                (_Var1._M_head_impl,sendbuf,recvbuf,(long)count,(ulong)DVar2,1,&local_48);
    }
    break;
  default:
    goto switchD_0073b585_default;
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
switchD_0073b585_default:
  return 0;
}

Assistant:

int SMPI_Allreduce(const void *sendbuf, void *recvbuf, int count, SMPI_Datatype datatype,
                   SMPI_Op op, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type)                                                                                    \
    SMPI_Allreduce_Impl(static_cast<const type *>(sendbuf), static_cast<type *>(recvbuf), count,   \
                        op, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}